

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatConsumer::ConvertOne
          (ParsedFormatConsumer *this,UnboundConversion *conv,string_view s)

{
  pointer *ppCVar1;
  char *pcVar2;
  ParsedFormatBase *pPVar3;
  undefined8 uVar4;
  iterator __position;
  ConversionItem local_38;
  
  memcpy(this->data_pos,s._M_str,s._M_len);
  pcVar2 = this->data_pos;
  this->data_pos = pcVar2 + s._M_len;
  pPVar3 = this->parsed;
  local_38.text_end =
       (long)(pcVar2 + s._M_len) -
       (long)(pPVar3->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
  local_38.is_conversion = true;
  uVar4._0_4_ = conv->arg_position;
  uVar4._4_4_ = conv->width;
  local_38.conv._8_7_ = SUB87((ulong)*(undefined8 *)((long)&(conv->width).value_ + 3) >> 8,0);
  local_38.conv._0_7_ = SUB87(uVar4,0);
  local_38.conv.width.value_._3_1_ = (undefined1)((uint)uVar4._4_4_ >> 0x18);
  __position._M_current =
       (pPVar3->items_).
       super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pPVar3->items_).
      super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
    ::_M_realloc_insert<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>
              (&pPVar3->items_,__position,&local_38);
  }
  else {
    ((__position._M_current)->conv).arg_position = (undefined4)uVar4;
    ((__position._M_current)->conv).width = (InputValue)uVar4._4_4_;
    ((__position._M_current)->conv).precision = (InputValue)local_38.conv.precision.value_;
    ((__position._M_current)->conv).flags = local_38.conv.flags;
    ((__position._M_current)->conv).length_mod = local_38.conv.length_mod;
    ((__position._M_current)->conv).conv = local_38.conv.conv;
    ((__position._M_current)->conv).field_0xf = local_38.conv._15_1_;
    *(ulong *)__position._M_current = CONCAT71(local_38._1_7_,1);
    (__position._M_current)->text_end = local_38.text_end;
    ppCVar1 = &(pPVar3->items_).
               super__Vector_base<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return true;
}

Assistant:

bool ConvertOne(const UnboundConversion &conv, string_view s) {
    size_t text_end = AppendText(s);
    parsed->items_.push_back({true, text_end, conv});
    return true;
  }